

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O0

void __thiscall Alice::LoadCorrelatedRandoms(Alice *this)

{
  iterator __first;
  iterator __last;
  allocator<long> local_2a1;
  istream_iterator<long,_char,_std::char_traits<char>,_long> local_2a0;
  istream_iterator<long,_char,_std::char_traits<char>,_long> local_288;
  undefined1 local_270 [8];
  vector<long,_std::allocator<long>_> numbers;
  istream_iterator<long,_char,_std::char_traits<char>,_long> end;
  undefined1 local_230 [8];
  istream_iterator<long,_char,_std::char_traits<char>,_long> start;
  ifstream fin;
  Alice *this_local;
  
  std::ifstream::ifstream(&start._M_ok,"../randoms/alice/Randoms_A.txt",8);
  std::istream_iterator<long,_char,_std::char_traits<char>,_long>::istream_iterator
            ((istream_iterator<long,_char,_std::char_traits<char>,_long> *)local_230,
             (istream_type *)&start._M_ok);
  std::istream_iterator<long,_char,_std::char_traits<char>,_long>::istream_iterator
            ((istream_iterator<long,_char,_std::char_traits<char>,_long> *)
             &numbers.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::istream_iterator<long,_char,_std::char_traits<char>,_long>::istream_iterator
            (&local_288,(istream_iterator<long,_char,_std::char_traits<char>,_long> *)local_230);
  std::istream_iterator<long,_char,_std::char_traits<char>,_long>::istream_iterator
            (&local_2a0,
             (istream_iterator<long,_char,_std::char_traits<char>,_long> *)
             &numbers.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::allocator<long>::allocator(&local_2a1);
  std::vector<long,std::allocator<long>>::
  vector<std::istream_iterator<long,char,std::char_traits<char>,long>,void>
            ((vector<long,std::allocator<long>> *)local_270,&local_288,&local_2a0,&local_2a1);
  std::allocator<long>::~allocator(&local_2a1);
  __first = std::vector<long,_std::allocator<long>_>::begin
                      ((vector<long,_std::allocator<long>_> *)local_270);
  __last = std::vector<long,_std::allocator<long>_>::end
                     ((vector<long,_std::allocator<long>_> *)local_270);
  std::vector<long,std::allocator<long>>::
  assign<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,void>
            ((vector<long,std::allocator<long>> *)&(this->super_Party).Randoms,
             (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
             __first._M_current,
             (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)__last._M_current
            );
  std::ifstream::close();
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)local_270);
  std::ifstream::~ifstream(&start._M_ok);
  return;
}

Assistant:

void Alice::LoadCorrelatedRandoms()
{
    std::ifstream fin("../randoms/alice/Randoms_A.txt");
    std::istream_iterator<long> start(fin), end;
    std::vector<long> numbers(start, end);
    Randoms.assign(numbers.begin(), numbers.end());
    fin.close();
}